

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm_distorm.c
# Opt level: O0

int funchook_disasm_init
              (funchook_disasm_t *disasm,funchook_t *funchook,uint8_t *code,size_t code_size,
              size_t address)

{
  _DecodeResult _Var1;
  _CodeInfo *in_RCX;
  undefined8 in_RDX;
  funchook_t *in_RSI;
  undefined8 *in_RDI;
  _DInst *in_R8;
  _DecodeResult decres;
  uint in_stack_ffffffffffffffcc;
  int local_4;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_R8;
  in_RDI[4] = in_RDX;
  *(int *)(in_RDI + 5) = (int)in_RCX;
  *(undefined4 *)((long)in_RDI + 0x2c) = 2;
  *(undefined4 *)(in_RDI + 6) = 0x10;
  *(undefined4 *)(in_RDI + 7) = 0;
  _Var1 = distorm_decompose64(in_RCX,in_R8,in_stack_ffffffffffffffcc,(uint *)0x103bfe);
  if (_Var1 == DECRES_SUCCESS) {
    local_4 = 0;
  }
  else {
    funchook_set_error_message(in_RSI,"Disassemble Error: %d",(ulong)_Var1);
    local_4 = 3;
  }
  return local_4;
}

Assistant:

int funchook_disasm_init(funchook_disasm_t *disasm, funchook_t *funchook, const uint8_t *code, size_t code_size, size_t address)
{
    _DecodeResult decres;

    disasm->funchook = funchook;
    disasm->ci.codeOffset = address;
    disasm->ci.code = code;
    disasm->ci.codeLen = (int)code_size;
#ifdef CPU_X86_64
    disasm->ci.dt = Decode64Bits;
#else
    disasm->ci.dt = Decode32Bits;
#endif
    disasm->ci.features = DF_STOP_ON_RET;
    disasm->idx = 0;
    decres = distorm_decompose64(&disasm->ci, disasm->dis, MAX_INSN_CHECK_SIZE, &disasm->cnt);
    if (decres != DECRES_SUCCESS) {
        funchook_set_error_message(funchook, "Disassemble Error: %d", decres);
        return FUNCHOOK_ERROR_DISASSEMBLY;
    }
    return 0;
}